

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injectionmanager.h
# Opt level: O0

void injection::InjectionManager::bind_transient<ITest>(function<ITest_*()> *maker)

{
  function<ITest_*()> local_30;
  function<ITest_*()> *local_10;
  function<ITest_*()> *maker_local;
  
  local_10 = maker;
  std::function<ITest_*()>::function(&local_30,maker);
  bind<ITest>(&local_30,TRANSIENT);
  std::function<ITest_*()>::~function(&local_30);
  return;
}

Assistant:

static void bind_transient(std::function<I*()> maker) {
        InjectionManager::bind<I>(maker, InjectionScope::TRANSIENT);
    }